

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestLoader.cpp
# Opt level: O2

void __thiscall
llbuild::ninja::ManifestLoader::ManifestLoaderImpl::actOnDefaultDecl
          (ManifestLoaderImpl *this,ArrayRef<llbuild::ninja::Token> nameToks)

{
  Node *in_RAX;
  Token *nameTok;
  long lVar1;
  Token *pTVar2;
  StringRef path0;
  Node *node;
  
  pTVar2 = nameToks.Data;
  node = in_RAX;
  for (lVar1 = nameToks.Length * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    path0.Length._0_4_ = pTVar2->length;
    path0.Data = pTVar2->start;
    path0.Length._4_4_ = 0;
    node = Manifest::findNode((this->manifest)._M_t.
                              super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                              .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl
                              ,this->workingDirectory,path0);
    if (node == (Node *)0x0) {
      (*(this->super_ParseActions)._vptr_ParseActions[2])(this,"unknown target name",0x13,pTVar2);
    }
    else {
      std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::push_back
                (&((this->manifest)._M_t.
                   super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                   .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl)->
                  defaultTargets,&node);
    }
    pTVar2 = pTVar2 + 1;
  }
  return;
}

Assistant:

virtual void actOnDefaultDecl(ArrayRef<Token> nameToks) override {
    // Resolve all of the inputs and outputs.
    for (const auto& nameTok: nameToks) {
      StringRef name(nameTok.start, nameTok.length);
      Node* node = manifest->findNode(workingDirectory, name);

      if (node == nullptr) {
        error("unknown target name", nameTok);
        continue;
      }

      manifest->getDefaultTargets().push_back(node);
    }
  }